

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O0

void boost::asio::detail::thread_info_base::deallocate
               (thread_info_base *this_thread,void *pointer,size_t size)

{
  ulong in_RDX;
  undefined1 *in_RSI;
  long *in_RDI;
  uchar *mem;
  
  if (((in_RDX < 0x3fd) && (in_RDI != (long *)0x0)) && (*in_RDI == 0)) {
    *in_RSI = in_RSI[in_RDX];
    *in_RDI = (long)in_RSI;
  }
  else {
    operator_delete(in_RSI);
  }
  return;
}

Assistant:

static void deallocate(thread_info_base* this_thread,
      void* pointer, std::size_t size)
  {
    if (size <= chunk_size * UCHAR_MAX)
    {
      if (this_thread && this_thread->reusable_memory_ == 0)
      {
        unsigned char* const mem = static_cast<unsigned char*>(pointer);
        mem[0] = mem[size];
        this_thread->reusable_memory_ = pointer;
        return;
      }
    }

    ::operator delete(pointer);
  }